

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
FASTER::core::
CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
::CallbackContext(CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
                  *this,IAsyncContext *context)

{
  unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  local_20;
  Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>
  *local_18;
  IAsyncContext *context_local;
  CallbackContext<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>
  *this_local;
  
  this->async = false;
  local_18 = (Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>
              *)context;
  context_local = (IAsyncContext *)this;
  std::
  unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::Node,std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>,std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>>>>,FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::Node,std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>,std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>>>>>>
  ::
  unique_ptr<FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::Node,std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>,std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>>>>>,void>
            ((unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::Node,std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>,std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>>>>,FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::Node,std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>,std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>>>>>>
              *)&this->context_);
  make_context_unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::Node,std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>,std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,unsigned_long,std::hash<unsigned_long>,4ul,8ul>::DataNode>>>>>
            ((core *)&local_20,local_18);
  std::
  unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  ::operator=(&this->context_,&local_20);
  std::
  unique_ptr<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>,_FASTER::core::ContextDeleter<neatlib::epoch::Delete_Context<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>_>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

CallbackContext(IAsyncContext* context)
    : async{ false } {
    context_ = make_context_unique_ptr(static_cast<C*>(context));
  }